

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O3

void __thiscall EOServer::Tick(EOServer *this)

{
  unordered_map<IPAddress,_ConnectionLogEntry,_std::hash<IPAddress>,_std::equal_to<IPAddress>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>_>
  *this_00;
  list<Client_*,_std::allocator<Client_*>_> *plVar1;
  EOServer *pEVar2;
  World *pWVar3;
  pointer ppCVar4;
  bool bVar5;
  IPAddress IVar6;
  Client *pCVar7;
  mapped_type *pmVar8;
  _Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true> it;
  mapped_type *pmVar9;
  vector<Client_*,_std::allocator<Client_*>_> *pvVar10;
  char *reason;
  pointer ppCVar11;
  int iVar12;
  EOServer *this_01;
  vector<Client_*,_std::allocator<Client_*>_> *__range2;
  _List_node_base *p_Var13;
  bool bVar14;
  double dVar15;
  IPAddress remote_addr;
  IPAddress local_84;
  _Map_base<IPAddress,_std::pair<const_IPAddress,_ConnectionLogEntry>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>,_std::__detail::_Select1st,_std::equal_to<IPAddress>,_std::hash<IPAddress>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_80;
  undefined1 local_78 [32];
  Client *local_58;
  EOServer *local_50;
  double local_48;
  int local_40;
  IPAddress local_3c;
  double local_38;
  
  pCVar7 = Server::Poll(&this->super_Server);
  if (pCVar7 != (Client *)0x0) {
    local_80 = (_Map_base<IPAddress,_std::pair<const_IPAddress,_ConnectionLogEntry>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>,_std::__detail::_Select1st,_std::equal_to<IPAddress>,_std::hash<IPAddress>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)Timer::GetTime();
    local_84 = Client::GetRemoteAddr(pCVar7);
    pWVar3 = this->world;
    pEVar2 = (EOServer *)(local_78 + 0x10);
    local_78._0_8_ = pEVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"IPReconnectLimit","");
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar3->config,(key_type *)local_78);
    local_38 = util::variant::GetFloat(pmVar8);
    if ((EOServer *)local_78._0_8_ != pEVar2) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    pWVar3 = this->world;
    local_78._0_8_ = pEVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"MaxConnectionsPerIP","");
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar3->config,(key_type *)local_78);
    local_40 = util::variant::GetInt(pmVar8);
    this_01 = (EOServer *)local_78._0_8_;
    local_58 = pCVar7;
    if ((EOServer *)local_78._0_8_ != pEVar2) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    this_00 = &this->connection_log;
    it._M_cur = (__node_type *)(this->connection_log)._M_h._M_before_begin._M_nxt;
    iVar12 = 0;
    local_50 = this;
    if (it._M_cur == (__node_type *)0x0) {
      bVar14 = false;
    }
    else {
      bVar14 = false;
      do {
        dVar15 = *(double *)((long)it._M_cur + 0x10) + local_38;
        if (((double)local_80 <= dVar15) ||
           ((double)local_80 <= *(double *)((long)it._M_cur + 0x18) + 30.0)) {
          this_01 = (EOServer *)((long)it._M_cur + 8);
          local_48 = dVar15;
          bVar5 = IPAddress::operator==((IPAddress *)this_01,&local_84);
          bVar14 = (bool)(bVar14 | ((double)local_80 <= local_48 && bVar5));
        }
        else {
          ClearClientRejections(this_01,(connection_log_iterator)it._M_cur);
          this_01 = (EOServer *)this_00;
          it._M_cur = (__node_type *)
                      std::
                      _Hashtable<IPAddress,_std::pair<const_IPAddress,_ConnectionLogEntry>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>,_std::__detail::_Select1st,_std::equal_to<IPAddress>,_std::hash<IPAddress>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::erase(&this_00->_M_h,it._M_cur);
          if (it._M_cur == (__node_type *)0x0) break;
        }
        it._M_cur = (__node_type *)((it._M_cur)->super__Hash_node_base)._M_nxt;
      } while (it._M_cur != (__node_type *)0x0);
    }
    pCVar7 = local_58;
    plVar1 = &(local_50->super_Server).clients;
    p_Var13 = (local_50->super_Server).clients.super__List_base<Client_*,_std::allocator<Client_*>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    local_80 = (_Map_base<IPAddress,_std::pair<const_IPAddress,_ConnectionLogEntry>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>,_std::__detail::_Select1st,_std::equal_to<IPAddress>,_std::hash<IPAddress>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)this_00;
    if (p_Var13 != (_List_node_base *)plVar1) {
      iVar12 = 0;
      do {
        IVar6 = Client::GetRemoteAddr((Client *)p_Var13[1]._M_next);
        local_78._0_4_ = IVar6.address;
        local_3c = Client::GetRemoteAddr(pCVar7);
        bVar5 = IPAddress::operator==((IPAddress *)local_78,&local_3c);
        iVar12 = iVar12 + (uint)bVar5;
        p_Var13 = p_Var13->_M_next;
      } while (p_Var13 != (_List_node_base *)plVar1);
    }
    this = local_50;
    pCVar7 = local_58;
    if (bVar14) {
      IVar6 = Client::GetRemoteAddr(local_58);
      local_78._0_4_ = IVar6.address;
      reason = "reconnecting too fast";
      this = local_50;
    }
    else {
      if ((local_40 == 0) || (iVar12 <= local_40)) {
        local_48 = Timer::GetTime();
        pmVar9 = std::__detail::
                 _Map_base<IPAddress,_std::pair<const_IPAddress,_ConnectionLogEntry>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>,_std::__detail::_Select1st,_std::equal_to<IPAddress>,_std::hash<IPAddress>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](local_80,&local_84);
        pmVar9->last_connection_time = local_48;
        goto LAB_0014d2de;
      }
      IVar6 = Client::GetRemoteAddr(local_58);
      local_78._0_4_ = IVar6.address;
      reason = "too many connections from this address";
    }
    RecordClientRejection(this,(IPAddress *)local_78,reason);
    Client::Close(pCVar7,true);
  }
LAB_0014d2de:
  pvVar10 = Server::Select(&this->super_Server,0.001);
  if (pvVar10 != (vector<Client_*,_std::allocator<Client_*>_> *)0x0) {
    ppCVar11 = (pvVar10->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    ppCVar4 = (pvVar10->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar11 != ppCVar4) {
      do {
        EOClient::Tick((EOClient *)*ppCVar11);
        ppCVar11 = ppCVar11 + 1;
      } while (ppCVar11 != ppCVar4);
      ppCVar11 = (pvVar10->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      if ((pvVar10->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
          super__Vector_impl_data._M_finish != ppCVar11) {
        (pvVar10->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
        super__Vector_impl_data._M_finish = ppCVar11;
      }
    }
  }
  Server::BuryTheDead(&this->super_Server);
  Timer::Tick(&this->world->timer);
  return;
}

Assistant:

void EOServer::Tick()
{
	std::vector<Client *> *active_clients = 0;
	EOClient *newclient = static_cast<EOClient *>(this->Poll());

	if (newclient)
	{
		double now = Timer::GetTime();
		int ip_connections = 0;
		bool throttle = false;
		IPAddress remote_addr = newclient->GetRemoteAddr();

		const double reconnect_limit = double(this->world->config["IPReconnectLimit"]);
		const int max_per_ip = int(this->world->config["MaxConnectionsPerIP"]);

		UTIL_IFOREACH(connection_log, connection)
		{
			double last_connection_time = connection->second.last_connection_time;
			double last_rejection_time = connection->second.last_rejection_time;

			if (last_connection_time + reconnect_limit < now
			 && last_rejection_time + 30.0 < now)
			{
				this->ClearClientRejections(connection);
				connection = connection_log.erase(connection);

				if (connection == connection_log.end())
					break;

				continue;
			}

			if (connection->first == remote_addr
			 && last_connection_time + reconnect_limit >= now)
			{
				throttle = true;
			}
		}

		UTIL_FOREACH(this->clients, client)
		{
			if (client->GetRemoteAddr() == newclient->GetRemoteAddr())
			{
				++ip_connections;
			}
		}

		if (throttle)
		{
			this->RecordClientRejection(newclient->GetRemoteAddr(), "reconnecting too fast");
			newclient->Close(true);
		}
		else if (max_per_ip != 0 && ip_connections > max_per_ip)
		{
			this->RecordClientRejection(newclient->GetRemoteAddr(), "too many connections from this address");
			newclient->Close(true);
		}
		else
		{
			connection_log[remote_addr].last_connection_time = Timer::GetTime();
		}
	}

	try
	{
		active_clients = this->Select(0.001);
	}
	catch (Socket_SelectFailed &e)
	{
		if (errno != EINTR)
			throw;
	}

	if (active_clients)
	{
		UTIL_FOREACH(*active_clients, client)
		{
			EOClient *eoclient = static_cast<EOClient *>(client);
			eoclient->Tick();
		}

		active_clients->clear();
	}

	this->BuryTheDead();

	this->world->timer.Tick();
}